

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_sig.c
# Opt level: O1

err_t cmdSigHash(octet *hash,size_t hash_len,char *name,size_t drop,octet *certs,size_t certs_len,
                octet *date)

{
  void *state;
  bool_t bVar1;
  size_t sVar2;
  blob_t blob;
  file_t file;
  size_t sVar3;
  err_t eVar4;
  ulong uVar5;
  uint uVar6;
  size_t count;
  err_t eVar7;
  
  if (hash_len < 0x21) {
    sVar2 = beltHash_keep();
  }
  else {
    sVar2 = bashHash_keep();
  }
  blob = blobCreate(sVar2 + 0x1000);
  if (blob == (blob_t)0x0) {
    eVar7 = 0x6e;
  }
  else {
    state = (void *)((long)blob + 0x1000);
    if (hash_len < 0x21) {
      beltHashStart(state);
    }
    else {
      bashHashStart(state,hash_len * 4);
    }
    file = fileOpen(name,"rb");
    if (file == (file_t)0x0) {
      eVar7 = 0xcb;
    }
    else {
      sVar2 = fileSize(file);
      uVar5 = sVar2 - drop;
      if (sVar2 == 0xffffffffffffffff || sVar2 < drop) {
        eVar4 = 0x132;
        if (drop <= sVar2) {
          eVar4 = 0;
        }
        eVar7 = 0xcf;
        if (sVar2 != 0xffffffffffffffff) {
          eVar7 = eVar4;
        }
        fileClose(file);
      }
      else {
        uVar6 = 0;
        sVar2 = hash_len;
        while (uVar5 != 0) {
          count = 0x1000;
          if (uVar5 < 0x1000) {
            count = uVar5;
          }
          sVar3 = fileRead2(blob,count,file);
          if (sVar3 != count) {
            uVar6 = 0xcf;
          }
          if (uVar6 == 0) {
            if (hash_len < 0x21) {
              beltHashStepH(blob,count,state);
            }
            else {
              bashHashStepH(blob,count,state);
            }
            uVar5 = uVar5 - count;
          }
          else {
            fileClose(file);
            blobClose(blob);
            sVar2 = (size_t)uVar6;
          }
          if (uVar6 != 0) {
            return (err_t)sVar2;
          }
        }
        bVar1 = fileClose(file);
        if (bVar1 == 0) {
          eVar7 = 0x67;
        }
        else {
          if (hash_len < 0x21) {
            beltHashStepH(certs,certs_len,state);
            beltHashStepH(date,6,state);
            beltHashStepG2(hash,hash_len,state);
          }
          else {
            bashHashStepH(certs,certs_len,state);
            bashHashStepH(date,6,state);
            bashHashStepG(hash,hash_len,state);
          }
          eVar7 = 0;
        }
      }
    }
    blobClose(blob);
  }
  return eVar7;
}

Assistant:

static err_t cmdSigHash(octet hash[], size_t hash_len, const char* name,
	size_t drop, const octet certs[], size_t certs_len, const octet date[6])
{
	const size_t buf_size = 4096;
	err_t code;
	octet* stack;
	octet* buf;
	void* state;
	file_t file;
	size_t size;
	// pre
	ASSERT(hash_len == 24 || hash_len == 32 || hash_len == 48 ||
		hash_len == 64);
	ASSERT(memIsValid(hash, hash_len));
	ASSERT(strIsValid(name));
	// выделить и разметить память
	code = cmdBlobCreate(stack, buf_size +
		(hash_len <= 32 ? beltHash_keep() : bashHash_keep()));
	ERR_CALL_CHECK(code);
	buf = (octet*)stack;
	state = buf + buf_size;
	// начать хэширование
	if (hash_len <= 32)
		beltHashStart(state);
	else
		bashHashStart(state, hash_len * 4);
	// открыть файл
	code = cmdFileOpen(file, name, "rb");
	ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	// определить размер файла
	size = fileSize(file);
	if (size == SIZE_MAX)
		code = ERR_FILE_READ;
	else if (size < drop)
		code = ERR_BAD_FORMAT;
	ERR_CALL_HANDLE(code, (cmdFileClose(file), cmdBlobClose(stack)));
	// хэшировать файл
	for (size -= drop; size;)
	{
		size_t count = MIN2(size, buf_size);
		if (fileRead2(buf, count, file) != count)
			code = ERR_FILE_READ;
		ERR_CALL_HANDLE(code, (cmdFileClose(file), cmdBlobClose(stack)));
		if (hash_len <= 32)
			beltHashStepH(stack, count, state);
		else
			bashHashStepH(stack, count, state);
		size -= count;
	}
	code = cmdFileClose(file);
	ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	// хэшировать сертификаты и дату
	if (hash_len <= 32)
	{
		beltHashStepH(certs, certs_len, state);
		beltHashStepH(date, 6, state);
		beltHashStepG2(hash, hash_len, state);
	}
	else
	{
		bashHashStepH(certs, certs_len, state);
		bashHashStepH(date, 6, state);
		bashHashStepG(hash, hash_len, state);
	}
	// завершить
	cmdBlobClose(stack);
	return code;
}